

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  int iVar33;
  int iVar34;
  uint32_t uVar35;
  uint32_t uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  long lVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint auStack_198 [10];
  undefined8 uStack_170;
  uint local_164 [3];
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  uint auStack_148 [60];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t *local_38;
  
  local_38 = ctx->state;
  local_58 = *(undefined8 *)ctx->state;
  uStack_50 = *(undefined8 *)(ctx->state + 2);
  local_48 = *(undefined8 *)(ctx->state + 4);
  uVar37 = *(undefined8 *)(ctx->state + 6);
  uStack_40 = uVar37;
  lVar41 = 0;
  do {
    auVar49 = *(undefined1 (*) [16])(data + lVar41 * 4);
    auVar50[1] = 0;
    auVar50[0] = auVar49[8];
    auVar50[2] = auVar49[9];
    auVar50[3] = 0;
    auVar50[4] = auVar49[10];
    auVar50[5] = 0;
    auVar50[6] = auVar49[0xb];
    auVar50[7] = 0;
    auVar50[8] = auVar49[0xc];
    auVar50[9] = 0;
    auVar50[10] = auVar49[0xd];
    auVar50[0xb] = 0;
    auVar50[0xc] = auVar49[0xe];
    auVar50[0xd] = 0;
    auVar50[0xe] = auVar49[0xf];
    auVar50[0xf] = 0;
    auVar50 = pshuflw(auVar50,auVar50,0x1b);
    auVar50 = pshufhw(auVar50,auVar50,0x1b);
    auVar26[0xd] = 0;
    auVar26._0_13_ = auVar49._0_13_;
    auVar26[0xe] = auVar49[7];
    auVar27[0xc] = auVar49[6];
    auVar27._0_12_ = auVar49._0_12_;
    auVar27._13_2_ = auVar26._13_2_;
    auVar28[0xb] = 0;
    auVar28._0_11_ = auVar49._0_11_;
    auVar28._12_3_ = auVar27._12_3_;
    auVar29[10] = auVar49[5];
    auVar29._0_10_ = auVar49._0_10_;
    auVar29._11_4_ = auVar28._11_4_;
    auVar30[9] = 0;
    auVar30._0_9_ = auVar49._0_9_;
    auVar30._10_5_ = auVar29._10_5_;
    auVar31[8] = auVar49[4];
    auVar31._0_8_ = auVar49._0_8_;
    auVar31._9_6_ = auVar30._9_6_;
    auVar38._7_8_ = 0;
    auVar38._0_7_ = auVar31._8_7_;
    auVar39._1_8_ = SUB158(auVar38 << 0x40,7);
    auVar39[0] = auVar49[3];
    auVar39._9_6_ = 0;
    auVar40._1_10_ = SUB1510(auVar39 << 0x30,5);
    auVar40[0] = auVar49[2];
    auVar40._11_4_ = 0;
    auVar32[2] = auVar49[1];
    auVar32._0_2_ = auVar49._0_2_;
    auVar32._3_12_ = SUB1512(auVar40 << 0x20,3);
    auVar49._0_2_ = auVar49._0_2_ & 0xff;
    auVar49._2_13_ = auVar32._2_13_;
    auVar49[0xf] = 0;
    auVar49 = pshuflw(auVar49,auVar49,0x1b);
    auVar49 = pshufhw(auVar49,auVar49,0x1b);
    sVar10 = auVar49._0_2_;
    sVar11 = auVar49._2_2_;
    sVar12 = auVar49._4_2_;
    sVar13 = auVar49._6_2_;
    sVar14 = auVar49._8_2_;
    sVar15 = auVar49._10_2_;
    sVar16 = auVar49._12_2_;
    sVar17 = auVar49._14_2_;
    sVar18 = auVar50._0_2_;
    sVar19 = auVar50._2_2_;
    sVar20 = auVar50._4_2_;
    sVar21 = auVar50._6_2_;
    sVar22 = auVar50._8_2_;
    sVar23 = auVar50._10_2_;
    sVar24 = auVar50._12_2_;
    sVar25 = auVar50._14_2_;
    lVar3 = lVar41 * 4;
    *(char *)(&uStack_158 + lVar41) = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0] - (0xff < sVar10)
    ;
    *(char *)((long)&uStack_158 + lVar3 + 1) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar49[2] - (0xff < sVar11);
    *(char *)((long)&uStack_158 + lVar3 + 2) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar49[4] - (0xff < sVar12);
    *(char *)((long)&uStack_158 + lVar3 + 3) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar49[6] - (0xff < sVar13);
    *(char *)(&uStack_154 + lVar41) = (0 < sVar14) * (sVar14 < 0x100) * auVar49[8] - (0xff < sVar14)
    ;
    *(char *)((long)&uStack_154 + lVar3 + 1) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar49[10] - (0xff < sVar15);
    *(char *)((long)&uStack_154 + lVar3 + 2) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar49[0xc] - (0xff < sVar16);
    *(char *)((long)&uStack_154 + lVar3 + 3) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar49[0xe] - (0xff < sVar17);
    *(char *)(&uStack_150 + lVar41) = (0 < sVar18) * (sVar18 < 0x100) * auVar50[0] - (0xff < sVar18)
    ;
    *(char *)((long)&uStack_150 + lVar3 + 1) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar50[2] - (0xff < sVar19);
    *(char *)((long)&uStack_150 + lVar3 + 2) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar50[4] - (0xff < sVar20);
    *(char *)((long)&uStack_150 + lVar3 + 3) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar50[6] - (0xff < sVar21);
    *(char *)(&uStack_14c + lVar41) = (0 < sVar22) * (sVar22 < 0x100) * auVar50[8] - (0xff < sVar22)
    ;
    *(char *)((long)&uStack_14c + lVar3 + 1) =
         (0 < sVar23) * (sVar23 < 0x100) * auVar50[10] - (0xff < sVar23);
    *(char *)((long)&uStack_14c + lVar3 + 2) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar50[0xc] - (0xff < sVar24);
    *(char *)((long)&uStack_14c + lVar3 + 3) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar50[0xe] - (0xff < sVar25);
    lVar41 = lVar41 + 4;
  } while (lVar41 != 0x10);
  uStack_40._4_4_ = (uint)((ulong)uVar37 >> 0x20);
  uStack_40._0_4_ = (uint)uVar37;
  local_48._4_4_ = (uint)((ulong)local_48 >> 0x20);
  local_58._4_4_ = (uint)((ulong)local_58 >> 0x20);
  uStack_50._4_4_ = (uint)((ulong)uStack_50 >> 0x20);
  lVar41 = 0;
  iVar47 = 1;
  do {
    local_164[0] = iVar47;
    iVar47 = (((uint)local_48 << 7 | (uint)local_48 >> 0x19) ^
             ((uint)local_48 << 0x15 | (uint)local_48 >> 0xb) ^
             ((uint)local_48 << 0x1a | (uint)local_48 >> 6)) + uStack_40._4_4_ + K[lVar41] +
             (&uStack_158)[lVar41] +
             ((local_48._4_4_ ^ (uint)uStack_40) & (uint)local_48 ^ (uint)uStack_40);
    uStack_50._4_4_ = uStack_50._4_4_ + iVar47;
    uStack_40._4_4_ =
         ((local_58._4_4_ | (uint)local_58) & (uint)uStack_50 | local_58._4_4_ & (uint)local_58) +
         (((uint)local_58 << 10 | (uint)local_58 >> 0x16) ^
         ((uint)local_58 << 0x13 | (uint)local_58 >> 0xd) ^
         ((uint)local_58 << 0x1e | (uint)local_58 >> 2)) + iVar47;
    iVar47 = ((local_48._4_4_ ^ (uint)local_48) & uStack_50._4_4_ ^ local_48._4_4_) +
             (uint)uStack_40 + K[lVar41 + 1] +
             ((uStack_50._4_4_ * 0x80 | uStack_50._4_4_ >> 0x19) ^
             (uStack_50._4_4_ * 0x200000 | uStack_50._4_4_ >> 0xb) ^
             (uStack_50._4_4_ * 0x4000000 | uStack_50._4_4_ >> 6)) + (&uStack_154)[lVar41];
    uStack_50._0_4_ = (uint)uStack_50 + iVar47;
    uStack_40._0_4_ =
         ((uStack_40._4_4_ | (uint)local_58) & local_58._4_4_ | uStack_40._4_4_ & (uint)local_58) +
         ((uStack_40._4_4_ * 0x400 | uStack_40._4_4_ >> 0x16) ^
         (uStack_40._4_4_ * 0x80000 | uStack_40._4_4_ >> 0xd) ^
         (uStack_40._4_4_ * 0x40000000 | uStack_40._4_4_ >> 2)) + iVar47;
    iVar47 = local_48._4_4_ + K[lVar41 + 2] + (&uStack_150)[lVar41] +
             ((uStack_50._4_4_ ^ (uint)local_48) & (uint)uStack_50 ^ (uint)local_48) +
             (((uint)uStack_50 * 0x80 | (uint)uStack_50 >> 0x19) ^
             ((uint)uStack_50 * 0x200000 | (uint)uStack_50 >> 0xb) ^
             ((uint)uStack_50 * 0x4000000 | (uint)uStack_50 >> 6));
    local_58._4_4_ = local_58._4_4_ + iVar47;
    local_48._4_4_ =
         iVar47 + (((uint)uStack_40 | uStack_40._4_4_) & (uint)local_58 |
                  (uint)uStack_40 & uStack_40._4_4_) +
                  (((uint)uStack_40 * 0x400 | (uint)uStack_40 >> 0x16) ^
                  ((uint)uStack_40 * 0x80000 | (uint)uStack_40 >> 0xd) ^
                  ((uint)uStack_40 * 0x40000000 | (uint)uStack_40 >> 2));
    iVar47 = (uint)local_48 + K[lVar41 + 3] + (&uStack_14c)[lVar41] +
             (((uint)uStack_50 ^ uStack_50._4_4_) & local_58._4_4_ ^ uStack_50._4_4_) +
             ((local_58._4_4_ * 0x80 | local_58._4_4_ >> 0x19) ^
             (local_58._4_4_ * 0x200000 | local_58._4_4_ >> 0xb) ^
             (local_58._4_4_ * 0x4000000 | local_58._4_4_ >> 6));
    local_58._0_4_ = (uint)local_58 + iVar47;
    local_48._0_4_ =
         iVar47 + ((local_48._4_4_ | (uint)uStack_40) & uStack_40._4_4_ |
                  local_48._4_4_ & (uint)uStack_40) +
                  ((local_48._4_4_ * 0x400 | local_48._4_4_ >> 0x16) ^
                  (local_48._4_4_ * 0x80000 | local_48._4_4_ >> 0xd) ^
                  (local_48._4_4_ * 0x40000000 | local_48._4_4_ >> 2));
    iVar47 = uStack_50._4_4_ + K[lVar41 + 4] + auStack_148[lVar41] +
             ((local_58._4_4_ ^ (uint)uStack_50) & (uint)local_58 ^ (uint)uStack_50) +
             (((uint)local_58 * 0x80 | (uint)local_58 >> 0x19) ^
             ((uint)local_58 * 0x200000 | (uint)local_58 >> 0xb) ^
             ((uint)local_58 * 0x4000000 | (uint)local_58 >> 6));
    uStack_40._4_4_ = uStack_40._4_4_ + iVar47;
    uStack_50._4_4_ =
         (((uint)local_48 | local_48._4_4_) & (uint)uStack_40 | (uint)local_48 & local_48._4_4_) +
         (((uint)local_48 * 0x400 | (uint)local_48 >> 0x16) ^
         ((uint)local_48 * 0x80000 | (uint)local_48 >> 0xd) ^
         ((uint)local_48 * 0x40000000 | (uint)local_48 >> 2)) + iVar47;
    iVar47 = (uint)uStack_50 + K[lVar41 + 5] + auStack_148[lVar41 + 1] +
             (((uint)local_58 ^ local_58._4_4_) & uStack_40._4_4_ ^ local_58._4_4_) +
             ((uStack_40._4_4_ * 0x80 | uStack_40._4_4_ >> 0x19) ^
             (uStack_40._4_4_ * 0x200000 | uStack_40._4_4_ >> 0xb) ^
             (uStack_40._4_4_ * 0x4000000 | uStack_40._4_4_ >> 6));
    uStack_40._0_4_ = (uint)uStack_40 + iVar47;
    uStack_50._0_4_ =
         ((uStack_50._4_4_ | (uint)local_48) & local_48._4_4_ | uStack_50._4_4_ & (uint)local_48) +
         ((uStack_50._4_4_ * 0x400 | uStack_50._4_4_ >> 0x16) ^
         (uStack_50._4_4_ * 0x80000 | uStack_50._4_4_ >> 0xd) ^
         (uStack_50._4_4_ * 0x40000000 | uStack_50._4_4_ >> 2)) + iVar47;
    iVar47 = local_58._4_4_ + K[lVar41 + 6] + auStack_148[lVar41 + 2] +
             ((uStack_40._4_4_ ^ (uint)local_58) & (uint)uStack_40 ^ (uint)local_58) +
             (((uint)uStack_40 * 0x80 | (uint)uStack_40 >> 0x19) ^
             ((uint)uStack_40 * 0x200000 | (uint)uStack_40 >> 0xb) ^
             ((uint)uStack_40 * 0x4000000 | (uint)uStack_40 >> 6));
    local_48._4_4_ = local_48._4_4_ + iVar47;
    local_58._4_4_ =
         (((uint)uStack_50 | uStack_50._4_4_) & (uint)local_48 | (uint)uStack_50 & uStack_50._4_4_)
         + (((uint)uStack_50 * 0x400 | (uint)uStack_50 >> 0x16) ^
           ((uint)uStack_50 * 0x80000 | (uint)uStack_50 >> 0xd) ^
           ((uint)uStack_50 * 0x40000000 | (uint)uStack_50 >> 2)) + iVar47;
    iVar47 = (uint)local_58 + K[lVar41 + 7] + auStack_148[lVar41 + 3] +
             (((uint)uStack_40 ^ uStack_40._4_4_) & local_48._4_4_ ^ uStack_40._4_4_) +
             ((local_48._4_4_ * 0x80 | local_48._4_4_ >> 0x19) ^
             (local_48._4_4_ * 0x200000 | local_48._4_4_ >> 0xb) ^
             (local_48._4_4_ * 0x4000000 | local_48._4_4_ >> 6));
    local_48._0_4_ = (uint)local_48 + iVar47;
    local_58._0_4_ =
         iVar47 + ((local_58._4_4_ | (uint)uStack_50) & uStack_50._4_4_ |
                  local_58._4_4_ & (uint)uStack_50) +
                  ((local_58._4_4_ * 0x400 | local_58._4_4_ >> 0x16) ^
                  (local_58._4_4_ * 0x80000 | local_58._4_4_ >> 0xd) ^
                  (local_58._4_4_ * 0x40000000 | local_58._4_4_ >> 2));
    lVar41 = 8;
    iVar47 = 0;
  } while ((char)local_164[0] != '\0');
  uVar42 = 0x10;
  do {
    uVar44 = (uint)local_48 << 0x1a;
    uVar7 = (uint)local_48 >> 6;
    uVar46 = (uint)local_48 << 0x15;
    uVar8 = (uint)local_48 >> 0xb;
    uVar6 = (uint)local_48 << 7;
    uVar9 = (uint)local_48 >> 0x19;
    uVar45 = (local_48._4_4_ ^ (uint)uStack_40) & (uint)local_48 ^ (uint)uStack_40;
    uVar43 = auStack_198[uVar42 + 1];
    uVar4 = local_164[uVar42 + 1];
    iVar47 = (uVar4 >> 10 ^ (uVar4 << 0xd | uVar4 >> 0x13) ^ (uVar4 << 0xf | uVar4 >> 0x11)) +
             auStack_198[uVar42 + 9] + auStack_198[uVar42] +
             (uVar43 >> 3 ^ (uVar43 << 0xe | uVar43 >> 0x12) ^ (uVar43 << 0x19 | uVar43 >> 7));
    (&uStack_158)[uVar42] = iVar47;
    iVar47 = ((uVar6 | uVar9) ^ (uVar46 | uVar8) ^ (uVar44 | uVar7)) + uStack_40._4_4_ + K[uVar42] +
             uVar45 + iVar47;
    uVar44 = iVar47 + uStack_50._4_4_;
    uStack_50._4_4_ = uVar44;
    uStack_40._4_4_ =
         ((local_58._4_4_ | (uint)local_58) & (uint)uStack_50 | local_58._4_4_ & (uint)local_58) +
         (((uint)local_58 << 10 | (uint)local_58 >> 0x16) ^
         ((uint)local_58 << 0x13 | (uint)local_58 >> 0xd) ^
         ((uint)local_58 << 0x1e | (uint)local_58 >> 2)) + iVar47;
    uVar46 = ((uint)local_48 ^ local_48._4_4_) & uVar44 ^ local_48._4_4_;
    uVar43 = local_164[uVar42 + 2];
    uVar4 = auStack_198[uVar42 + 2];
    iVar47 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             auStack_198[uVar42 + 10] + auStack_198[uVar42 + 1] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    (&uStack_154)[uVar42] = iVar47;
    iVar47 = iVar47 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)uStack_40 + K[uVar42 + 1];
    uVar44 = iVar47 + (uint)uStack_50;
    uStack_50._0_4_ = uVar44;
    uStack_40._0_4_ =
         (((uint)local_58 | uStack_40._4_4_) & local_58._4_4_ | (uint)local_58 & uStack_40._4_4_) +
         ((uStack_40._4_4_ << 10 | uStack_40._4_4_ >> 0x16) ^
         (uStack_40._4_4_ << 0x13 | uStack_40._4_4_ >> 0xd) ^
         (uStack_40._4_4_ << 0x1e | uStack_40._4_4_ >> 2)) + iVar47;
    uVar43 = (&uStack_158)[uVar42];
    uVar4 = auStack_198[uVar42 + 3];
    uVar46 = (uStack_50._4_4_ ^ (uint)local_48) & uVar44 ^ (uint)local_48;
    iVar47 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             auStack_198[uVar42 + 0xb] + auStack_198[uVar42 + 2] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    uVar5 = K[uVar42 + 2];
    (&uStack_150)[uVar42] = iVar47;
    iVar47 = iVar47 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             local_48._4_4_ + uVar5;
    uVar44 = iVar47 + local_58._4_4_;
    local_58._4_4_ = uVar44;
    local_48._4_4_ =
         ((uStack_40._4_4_ | (uint)uStack_40) & (uint)local_58 | uStack_40._4_4_ & (uint)uStack_40)
         + (((uint)uStack_40 << 10 | (uint)uStack_40 >> 0x16) ^
           ((uint)uStack_40 << 0x13 | (uint)uStack_40 >> 0xd) ^
           ((uint)uStack_40 << 0x1e | (uint)uStack_40 >> 2)) + iVar47;
    uVar43 = (&uStack_154)[uVar42];
    uVar4 = auStack_198[uVar42 + 4];
    uVar46 = ((uint)uStack_50 ^ uStack_50._4_4_) & uVar44 ^ uStack_50._4_4_;
    iVar47 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             auStack_198[uVar42 + 0xc] + auStack_198[uVar42 + 3] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    (&uStack_14c)[uVar42] = iVar47;
    iVar47 = iVar47 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)local_48 + K[uVar42 + 3];
    uVar44 = iVar47 + (uint)local_58;
    local_58._0_4_ = uVar44;
    local_48._0_4_ =
         (((uint)uStack_40 | local_48._4_4_) & uStack_40._4_4_ | (uint)uStack_40 & local_48._4_4_) +
         ((local_48._4_4_ << 10 | local_48._4_4_ >> 0x16) ^
         (local_48._4_4_ << 0x13 | local_48._4_4_ >> 0xd) ^
         (local_48._4_4_ << 0x1e | local_48._4_4_ >> 2)) + iVar47;
    uVar46 = (local_58._4_4_ ^ (uint)uStack_50) & uVar44 ^ (uint)uStack_50;
    uVar43 = auStack_198[uVar42 + 5];
    uVar4 = (&uStack_150)[uVar42];
    uVar43 = (uVar4 >> 10 ^ (uVar4 << 0xd | uVar4 >> 0x13) ^ (uVar4 << 0xf | uVar4 >> 0x11)) +
             local_164[uVar42] + auStack_198[uVar42 + 4] +
             (uVar43 >> 3 ^ (uVar43 << 0xe | uVar43 >> 0x12) ^ (uVar43 << 0x19 | uVar43 >> 7));
    auStack_148[uVar42] = uVar43;
    iVar47 = uVar43 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             uStack_50._4_4_ + K[uVar42 + 4];
    uVar44 = iVar47 + uStack_40._4_4_;
    uStack_40._4_4_ = uVar44;
    uStack_50._4_4_ =
         ((local_48._4_4_ | (uint)local_48) & (uint)uStack_40 | local_48._4_4_ & (uint)local_48) +
         (((uint)local_48 << 10 | (uint)local_48 >> 0x16) ^
         ((uint)local_48 << 0x13 | (uint)local_48 >> 0xd) ^
         ((uint)local_48 << 0x1e | (uint)local_48 >> 2)) + iVar47;
    uVar46 = ((uint)local_58 ^ local_58._4_4_) & uVar44 ^ local_58._4_4_;
    uVar43 = (&uStack_14c)[uVar42];
    uVar4 = auStack_198[uVar42 + 6];
    uVar43 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             local_164[uVar42 + 1] + auStack_198[uVar42 + 5] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    auStack_148[uVar42 + 1] = uVar43;
    iVar47 = uVar43 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             (uint)uStack_50 + K[uVar42 + 5];
    uVar44 = iVar47 + (uint)uStack_40;
    uStack_40._0_4_ = uVar44;
    uStack_50._0_4_ =
         (((uint)local_48 | uStack_50._4_4_) & local_48._4_4_ | (uint)local_48 & uStack_50._4_4_) +
         ((uStack_50._4_4_ << 10 | uStack_50._4_4_ >> 0x16) ^
         (uStack_50._4_4_ << 0x13 | uStack_50._4_4_ >> 0xd) ^
         (uStack_50._4_4_ << 0x1e | uStack_50._4_4_ >> 2)) + iVar47;
    uVar43 = auStack_148[uVar42];
    uVar4 = auStack_198[uVar42 + 7];
    uVar46 = (uStack_40._4_4_ ^ (uint)local_58) & uVar44 ^ (uint)local_58;
    uVar43 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             local_164[uVar42 + 2] + auStack_198[uVar42 + 6] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    uVar5 = K[uVar42 + 6];
    auStack_148[uVar42 + 2] = uVar43;
    iVar47 = uVar43 + uVar46 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             local_58._4_4_ + uVar5;
    uVar44 = iVar47 + local_48._4_4_;
    local_48._4_4_ = uVar44;
    local_58._4_4_ =
         ((uStack_50._4_4_ | (uint)uStack_50) & (uint)local_48 | uStack_50._4_4_ & (uint)uStack_50)
         + (((uint)uStack_50 << 10 | (uint)uStack_50 >> 0x16) ^
           ((uint)uStack_50 << 0x13 | (uint)uStack_50 >> 0xd) ^
           ((uint)uStack_50 << 0x1e | (uint)uStack_50 >> 2)) + iVar47;
    uVar43 = auStack_148[uVar42 + 1];
    uVar4 = auStack_198[uVar42 + 8];
    uVar46 = ((uint)uStack_40 ^ uStack_40._4_4_) & uVar44 ^ uStack_40._4_4_;
    uVar43 = (uVar43 >> 10 ^ (uVar43 << 0xd | uVar43 >> 0x13) ^ (uVar43 << 0xf | uVar43 >> 0x11)) +
             (&uStack_158)[uVar42] + auStack_198[uVar42 + 7] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    auStack_148[uVar42 + 3] = uVar43;
    local_164[1] = uVar43 + uVar46 +
                   ((uVar44 * 0x80 | uVar44 >> 0x19) ^
                   (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
                   (uint)local_58 + K[uVar42 + 7];
    local_164[2] = (((uint)uStack_50 | local_58._4_4_) & uStack_50._4_4_ |
                   (uint)uStack_50 & local_58._4_4_) +
                   ((local_58._4_4_ << 10 | local_58._4_4_ >> 0x16) ^
                   (local_58._4_4_ << 0x13 | local_58._4_4_ >> 0xd) ^
                   (local_58._4_4_ << 0x1e | local_58._4_4_ >> 2));
    local_48._0_4_ = (uint)local_48 + local_164[1];
    local_58._0_4_ = local_164[2] + local_164[1];
    bVar48 = uVar42 < 0x38;
    uVar42 = uVar42 + 8;
  } while (bVar48);
  lVar41 = 0;
  do {
    lVar3 = lVar41 * 4;
    iVar47 = *(int *)((long)&local_58 + lVar3 + 4);
    iVar33 = *(int *)((long)&uStack_50 + lVar3);
    iVar34 = *(int *)((long)&uStack_50 + lVar3 + 4);
    puVar1 = local_38 + lVar41;
    uVar5 = puVar1[1];
    uVar35 = puVar1[2];
    uVar36 = puVar1[3];
    puVar2 = local_38 + lVar41;
    *puVar2 = *puVar1 + *(int *)((long)&local_58 + lVar3);
    puVar2[1] = uVar5 + iVar47;
    puVar2[2] = uVar35 + iVar33;
    puVar2[3] = uVar36 + iVar34;
    lVar41 = lVar41 + 4;
  } while (lVar41 != 8);
  uStack_170 = 0x1883626;
  mbedtls_platform_zeroize(local_164 + 1,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}